

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::SkipFallback
          (EpsCopyInputStream *this,char *ptr,int size)

{
  char *pcVar1;
  anon_class_1_0_00000001 *in_stack_00000070;
  int in_stack_0000007c;
  char *in_stack_00000080;
  EpsCopyInputStream *in_stack_00000088;
  
  pcVar1 = AppendSize<google::protobuf::internal::EpsCopyInputStream::SkipFallback(char_const*,int)::__0>
                     (in_stack_00000088,in_stack_00000080,in_stack_0000007c,in_stack_00000070);
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::SkipFallback(const char* ptr, int size) {
  return AppendSize(ptr, size, [](const char* p, int s) {});
}